

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Fallback(CodedInputStream *this,uint64 *value)

{
  byte *pbVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar7;
  
  pbVar1 = this->buffer_;
  pbVar2 = this->buffer_end_;
  iVar4 = (int)pbVar1;
  if (((int)pbVar2 - iVar4 < 10) && ((pbVar2 <= pbVar1 || ((char)pbVar2[-1] < '\0')))) {
    bVar3 = ReadVarint64Slow(this,value);
    return bVar3;
  }
  uVar8 = *pbVar1 & 0x7f;
  uVar7 = 0;
  uVar6 = 0;
  if ((char)*pbVar1 < '\0') {
    uVar8 = uVar8 | (pbVar1[1] & 0x7f) << 7;
    if ((char)pbVar1[1] < '\0') {
      uVar8 = uVar8 | (pbVar1[2] & 0x7f) << 0xe;
      if ((char)pbVar1[2] < '\0') {
        uVar8 = uVar8 | (pbVar1[3] & 0x7f) << 0x15;
        if ((char)pbVar1[3] < '\0') {
          uVar9 = pbVar1[4] & 0x7f;
          if ((char)pbVar1[4] < '\0') {
            uVar9 = uVar9 | (pbVar1[5] & 0x7f) << 7;
            if ((char)pbVar1[5] < '\0') {
              uVar9 = uVar9 | (pbVar1[6] & 0x7f) << 0xe;
              if ((char)pbVar1[6] < '\0') {
                uVar9 = uVar9 | (pbVar1[7] & 0x7f) << 0x15;
                if ((char)pbVar1[7] < '\0') {
                  uVar5 = pbVar1[8] & 0x7f;
                  uVar6 = (ulong)uVar5;
                  if ((char)pbVar1[8] < '\0') {
                    if ((char)pbVar1[9] < '\0') {
                      return false;
                    }
                    iVar10 = iVar4 + 10;
                    uVar6 = (ulong)((pbVar1[9] & 0x7f) << 7 | uVar5);
                  }
                  else {
                    iVar10 = iVar4 + 9;
                  }
                }
                else {
                  iVar10 = iVar4 + 8;
                }
              }
              else {
                iVar10 = iVar4 + 7;
              }
            }
            else {
              iVar10 = iVar4 + 6;
              uVar6 = uVar7;
            }
          }
          else {
            iVar10 = iVar4 + 5;
            uVar6 = uVar7;
          }
          goto LAB_0016ba24;
        }
        iVar10 = iVar4 + 4;
      }
      else {
        iVar10 = iVar4 + 3;
      }
    }
    else {
      iVar10 = iVar4 + 2;
    }
  }
  else {
    iVar10 = iVar4 + 1;
  }
  uVar9 = 0;
  uVar6 = uVar7;
LAB_0016ba24:
  this->buffer_ = pbVar1 + (iVar10 - iVar4);
  *value = uVar6 << 0x38 | (ulong)uVar9 << 0x1c | (ulong)uVar8;
  return true;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return buffer_end_ - buffer_;
}